

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  int x_8;
  int x_7;
  int x_6;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  int y_1;
  int x_2;
  int x_1;
  int x;
  int y;
  char *outptr;
  char *ptr;
  int h;
  int w;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  undefined1 *local_40;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  iVar2 = (int)in_RSI[6];
  local_40 = (undefined1 *)*in_RDI;
  local_48 = *in_RSI;
  if (in_R8D == 0) {
    for (local_4c = 0; local_4c < in_EDX; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
        *(undefined1 *)(local_48 + local_50) = in_R9B;
      }
      local_48 = local_48 + iVar1;
    }
    for (; local_4c < in_EDX + *(int *)(in_RDI + 6); local_4c = local_4c + 1) {
      for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
        *(undefined1 *)(local_48 + local_54) = in_R9B;
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_54 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_54 = local_54 + 1) {
          *(undefined1 *)(local_48 + local_54) = local_40[local_54 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_54 = *(int *)((long)in_RDI + 0x2c) + local_54;
      }
      for (; local_54 < iVar1; local_54 = local_54 + 1) {
        *(undefined1 *)(local_48 + local_54) = in_R9B;
      }
      local_40 = local_40 + *(int *)((long)in_RDI + 0x2c);
      local_48 = local_48 + iVar1;
    }
    for (; local_4c < iVar2; local_4c = local_4c + 1) {
      for (local_58 = 0; local_58 < iVar1; local_58 = local_58 + 1) {
        *(undefined1 *)(local_48 + local_58) = in_R9B;
      }
      local_48 = local_48 + iVar1;
    }
  }
  if (in_R8D == 1) {
    for (local_5c = 0; local_5c < in_EDX; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < in_ECX; local_60 = local_60 + 1) {
        *(undefined1 *)(local_48 + local_60) = *local_40;
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_60 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_60 = local_60 + 1) {
          *(undefined1 *)(local_48 + local_60) = local_40[local_60 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_60 = *(int *)((long)in_RDI + 0x2c) + local_60;
      }
      for (; local_60 < iVar1; local_60 = local_60 + 1) {
        *(undefined1 *)(local_48 + local_60) = local_40[*(int *)((long)in_RDI + 0x2c) + -1];
      }
      local_48 = local_48 + iVar1;
    }
    for (; local_5c < in_EDX + *(int *)(in_RDI + 6); local_5c = local_5c + 1) {
      for (local_64 = 0; local_64 < in_ECX; local_64 = local_64 + 1) {
        *(undefined1 *)(local_48 + local_64) = *local_40;
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_64 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_64 = local_64 + 1) {
          *(undefined1 *)(local_48 + local_64) = local_40[local_64 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_64 = *(int *)((long)in_RDI + 0x2c) + local_64;
      }
      for (; local_64 < iVar1; local_64 = local_64 + 1) {
        *(undefined1 *)(local_48 + local_64) = local_40[*(int *)((long)in_RDI + 0x2c) + -1];
      }
      local_40 = local_40 + *(int *)((long)in_RDI + 0x2c);
      local_48 = local_48 + iVar1;
    }
    local_40 = local_40 + -(long)*(int *)((long)in_RDI + 0x2c);
    for (; local_5c < iVar2; local_5c = local_5c + 1) {
      for (local_68 = 0; local_68 < in_ECX; local_68 = local_68 + 1) {
        *(undefined1 *)(local_48 + local_68) = *local_40;
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_68 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_68 = local_68 + 1) {
          *(undefined1 *)(local_48 + local_68) = local_40[local_68 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_68 = *(int *)((long)in_RDI + 0x2c) + local_68;
      }
      for (; local_68 < iVar1; local_68 = local_68 + 1) {
        *(undefined1 *)(local_48 + local_68) = local_40[*(int *)((long)in_RDI + 0x2c) + -1];
      }
      local_48 = local_48 + iVar1;
    }
  }
  if (in_R8D == 2) {
    local_6c = 0;
    local_40 = local_40 + in_EDX * *(int *)((long)in_RDI + 0x2c);
    for (; local_6c < in_EDX; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < in_ECX; local_70 = local_70 + 1) {
        *(undefined1 *)(local_48 + local_70) = local_40[in_ECX - local_70];
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_70 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_70 = local_70 + 1) {
          *(undefined1 *)(local_48 + local_70) = local_40[local_70 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_70 = *(int *)((long)in_RDI + 0x2c) + local_70;
      }
      for (; local_70 < iVar1; local_70 = local_70 + 1) {
        *(undefined1 *)(local_48 + local_70) =
             local_40[(*(int *)((long)in_RDI + 0x2c) -
                      ((local_70 - in_ECX) - *(int *)((long)in_RDI + 0x2c))) + -2];
      }
      local_48 = local_48 + iVar1;
      local_40 = local_40 + -(long)*(int *)((long)in_RDI + 0x2c);
    }
    for (; local_6c < in_EDX + *(int *)(in_RDI + 6); local_6c = local_6c + 1) {
      for (local_74 = 0; local_74 < in_ECX; local_74 = local_74 + 1) {
        *(undefined1 *)(local_48 + local_74) = local_40[in_ECX - local_74];
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_74 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_74 = local_74 + 1) {
          *(undefined1 *)(local_48 + local_74) = local_40[local_74 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_74 = *(int *)((long)in_RDI + 0x2c) + local_74;
      }
      for (; local_74 < iVar1; local_74 = local_74 + 1) {
        *(undefined1 *)(local_48 + local_74) =
             local_40[(*(int *)((long)in_RDI + 0x2c) -
                      ((local_74 - in_ECX) - *(int *)((long)in_RDI + 0x2c))) + -2];
      }
      local_40 = local_40 + *(int *)((long)in_RDI + 0x2c);
      local_48 = local_48 + iVar1;
    }
    local_40 = local_40 + -(long)(*(int *)((long)in_RDI + 0x2c) << 1);
    for (; local_6c < iVar2; local_6c = local_6c + 1) {
      for (local_78 = 0; local_78 < in_ECX; local_78 = local_78 + 1) {
        *(undefined1 *)(local_48 + local_78) = local_40[in_ECX - local_78];
      }
      if (*(int *)((long)in_RDI + 0x2c) < 0xc) {
        for (; local_78 < in_ECX + *(int *)((long)in_RDI + 0x2c); local_78 = local_78 + 1) {
          *(undefined1 *)(local_48 + local_78) = local_40[local_78 - in_ECX];
        }
      }
      else {
        memcpy((void *)(local_48 + in_ECX),local_40,(long)*(int *)((long)in_RDI + 0x2c));
        local_78 = *(int *)((long)in_RDI + 0x2c) + local_78;
      }
      for (; local_78 < iVar1; local_78 = local_78 + 1) {
        *(undefined1 *)(local_48 + local_78) =
             local_40[(*(int *)((long)in_RDI + 0x2c) -
                      ((local_78 - in_ECX) - *(int *)((long)in_RDI + 0x2c))) + -2];
      }
      local_48 = local_48 + iVar1;
      local_40 = local_40 + -(long)*(int *)((long)in_RDI + 0x2c);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}